

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O0

void reorder_tool(tool_t *new_tool)

{
  int iVar1;
  bool bVar2;
  tool_t *cur;
  int new_priority;
  tool_t *new_tool_local;
  
  iVar1 = (new_tool->config).priority;
  if ((tools == (tool_t *)0x0) || (iVar1 <= (tools->config).priority)) {
    new_tool->next_tool = tools;
    tools = new_tool;
  }
  else {
    cur = tools;
    while( true ) {
      bVar2 = false;
      if (cur->next_tool != (tool_t *)0x0) {
        bVar2 = (cur->next_tool->config).priority < iVar1;
      }
      if (!bVar2) break;
      cur = cur->next_tool;
    }
    new_tool->next_tool = cur->next_tool;
    cur->next_tool = new_tool;
  }
  return;
}

Assistant:

void reorder_tool(tool_t* new_tool) {
  int new_priority = new_tool->config.priority;
  if(tools==NULL || tools->config.priority >= new_priority ){
     new_tool->next_tool = tools;
     tools = new_tool;
  }
  else{
     struct tool_t *cur = tools;
     while((cur->next_tool != NULL) && cur->next_tool->config.priority < new_priority){
        cur = cur->next_tool;
     }
     new_tool->next_tool = cur->next_tool;
     cur->next_tool = new_tool;
  }
}